

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

void __thiscall Clasp::Solver::removeConditional(Solver *this)

{
  ConstraintDB *this_00;
  uint uVar1;
  pointer ppCVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  long *plVar4;
  
  if ((this->tag_).rep_ < 4) {
    return;
  }
  this_00 = &this->learnts_;
  uVar1 = (this->learnts_).ebo_.size;
  uVar5 = 0;
  uVar6 = 0;
  while( true ) {
    ppCVar2 = (this_00->ebo_).buf;
    if (uVar1 == uVar5) break;
    iVar3 = (*ppCVar2[uVar5]->_vptr_Constraint[9])();
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    if ((plVar4 == (long *)0x0) || (-1 < (int)plVar4[2])) {
      ppCVar2 = (this_00->ebo_).buf;
      ppCVar2[uVar6] = ppCVar2[uVar5];
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    else {
      (**(code **)(*plVar4 + 0x28))(plVar4,this,1);
    }
    uVar5 = uVar5 + 1;
  }
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
            (this_00,ppCVar2 + uVar6,ppCVar2 + (this->learnts_).ebo_.size);
  return;
}

Assistant:

inline bool    isSentinel(Literal p) { return p.var() == sentVar; }